

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_DiskFileToVirtualFile_Test::
~DiskSourceTreeTest_DiskFileToVirtualFile_Test(DiskSourceTreeTest_DiskFileToVirtualFile_Test *this)

{
  (this->super_DiskSourceTreeTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskSourceTreeTest_018d6ae0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_DiskSourceTreeTest).dirnames_);
  DiskSourceTree::~DiskSourceTree(&(this->super_DiskSourceTreeTest).source_tree_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, DiskFileToVirtualFile) {
  // Test DiskFileToVirtualFile.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddFile(absl::StrCat(dirnames_[1], "/foo"), "This file should be hidden.");
  source_tree_.MapPath("bar", dirnames_[0]);
  source_tree_.MapPath("bar", dirnames_[1]);

  std::string virtual_file;
  std::string shadowing_disk_file;

  EXPECT_EQ(DiskSourceTree::NO_MAPPING,
            source_tree_.DiskFileToVirtualFile("/foo", &virtual_file,
                                               &shadowing_disk_file));

  EXPECT_EQ(DiskSourceTree::SHADOWED, source_tree_.DiskFileToVirtualFile(
                                          absl::StrCat(dirnames_[1], "/foo"),
                                          &virtual_file, &shadowing_disk_file));
  EXPECT_EQ("bar/foo", virtual_file);
  EXPECT_EQ(absl::StrCat(dirnames_[0], "/foo"), shadowing_disk_file);

  EXPECT_EQ(
      DiskSourceTree::CANNOT_OPEN,
      source_tree_.DiskFileToVirtualFile(absl::StrCat(dirnames_[1], "/baz"),
                                         &virtual_file, &shadowing_disk_file));
  EXPECT_EQ("bar/baz", virtual_file);

  EXPECT_EQ(DiskSourceTree::SUCCESS, source_tree_.DiskFileToVirtualFile(
                                         absl::StrCat(dirnames_[0], "/foo"),
                                         &virtual_file, &shadowing_disk_file));
  EXPECT_EQ("bar/foo", virtual_file);
}